

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

char * get_imm_str_s(uint size)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  char *pcVar3;
  
  if (size == 1) {
    uVar1 = dasm_read_imm_16(1);
    make_signed_hex_str_16(uVar1);
    pcVar3 = make_signed_hex_str_16::str;
  }
  else if (size == 0) {
    uVar1 = dasm_read_imm_8(0);
    make_signed_hex_str_8(uVar1);
    pcVar3 = make_signed_hex_str_8::str;
  }
  else {
    uVar1 = dasm_read_imm_32(size);
    make_signed_hex_str_32(uVar1);
    pcVar3 = make_signed_hex_str_32::str;
  }
  iVar2 = sprintf(get_imm_str_s::str,"#%s",pcVar3,in_RAX);
  return (char *)CONCAT44(extraout_var,iVar2);
}

Assistant:

static char* get_imm_str_s(uint size)
{
	static char str[15];
	if(size == 0)
		sprintf(str, "#%s", make_signed_hex_str_8(read_imm_8()));
	else if(size == 1)
		sprintf(str, "#%s", make_signed_hex_str_16(read_imm_16()));
	else
		sprintf(str, "#%s", make_signed_hex_str_32(read_imm_32()));
	return str;
}